

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  int iVar1;
  ImGuiContext_conflict1 *pIVar2;
  uint uVar3;
  int iVar4;
  ImGuiContext *g;
  float *pfVar5;
  uint uVar6;
  ulong idx;
  bool bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 IVar15;
  float fVar16;
  float fVar17;
  float logarithmic_zero_epsilon;
  float fVar18;
  
  pIVar2 = GImGui;
  iVar1 = v_min - v_max;
  if (v_min < v_max) {
    iVar1 = -(v_min - v_max);
  }
  uVar3 = flags & 0x100000;
  idx = (ulong)(uVar3 >> 0x14);
  uVar6 = data_type & 0xfffffffe;
  fVar9 = ImVec2::operator[](&bb->Max,idx);
  fVar10 = ImVec2::operator[](&bb->Min,idx);
  fVar10 = (fVar9 - fVar10) + -4.0;
  fVar9 = (pIVar2->Style).GrabMinSize;
  if (-1 < iVar1 && uVar6 != 8) {
    fVar16 = fVar10 / (float)(iVar1 + 1);
    uVar8 = -(uint)(fVar9 <= fVar16);
    fVar9 = (float)(~uVar8 & (uint)fVar9 | (uint)fVar16 & uVar8);
  }
  fVar16 = ImVec2::operator[](&bb->Min,idx);
  fVar11 = ImVec2::operator[](&bb->Max,idx);
  if (fVar10 <= fVar9) {
    fVar9 = fVar10;
  }
  fVar18 = fVar10 - fVar9;
  fVar17 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar6 == 8) {
      iVar4 = ImParseFormatPrecision(format,3);
      fVar17 = (float)iVar4;
    }
    else {
      fVar17 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar17);
    fVar17 = fVar18;
    if (fVar18 <= 1.0) {
      fVar17 = 1.0;
    }
    fVar17 = ((pIVar2->Style).LogSliderDeadzone * 0.5) / fVar17;
  }
  fVar16 = fVar16 + 2.0 + fVar9 * 0.5;
  if (pIVar2->ActiveId == id) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar2->ActiveIdIsJustActivated == true) {
        pIVar2->SliderCurrentAccum = 0.0;
        pIVar2->SliderCurrentAccumDirty = false;
      }
      IVar15 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar18 = IVar15.x;
      if (uVar3 != 0) {
        fVar18 = -IVar15.y;
      }
      if ((fVar18 != 0.0) || (NAN(fVar18))) {
        if ((uVar6 == 8) && (iVar4 = ImParseFormatPrecision(format,3), 0 < iVar4)) {
          fVar18 = fVar18 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar18 = fVar18 / 10.0;
          }
        }
        else if ((iVar1 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar18 = *(float *)(&DAT_00250f30 + (ulong)(fVar18 < 0.0) * 4) / (float)iVar1;
        }
        else {
          fVar18 = fVar18 / 100.0;
        }
        uVar6 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar18 = (float)(~uVar6 & (uint)fVar18 | (uint)(fVar18 * 10.0) & uVar6) +
                 pIVar2->SliderCurrentAccum;
        pIVar2->SliderCurrentAccum = fVar18;
        pIVar2->SliderCurrentAccumDirty = true;
      }
      else {
        fVar18 = pIVar2->SliderCurrentAccum;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar2->SliderCurrentAccumDirty == true) {
        bVar7 = SUB41((flags & 0x20U) >> 5,0);
        fVar13 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,*v,v_min,v_max,bVar7,logarithmic_zero_epsilon,fVar17);
        if (((1.0 <= fVar13) && (0.0 < fVar18)) || ((fVar13 <= 0.0 && (fVar18 < 0.0)))) {
          pIVar2->SliderCurrentAccum = 0.0;
          pIVar2->SliderCurrentAccumDirty = false;
          goto LAB_00217741;
        }
        fVar14 = fVar18 + fVar13;
        fVar12 = 1.0;
        if (fVar14 <= 1.0) {
          fVar12 = fVar14;
        }
        fVar12 = (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar12);
        uVar6 = ScaleValueFromRatioT<unsigned_int,int,float>
                          (data_type,fVar12,v_min,v_max,bVar7,logarithmic_zero_epsilon,fVar17);
        if ((flags & 0x40U) == 0) {
          uVar6 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar6);
        }
        fVar14 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar6,v_min,v_max,bVar7,logarithmic_zero_epsilon,fVar17);
        fVar14 = fVar14 - fVar13;
        bVar7 = fVar18 <= fVar14;
        if (0.0 < fVar18) {
          bVar7 = fVar14 < fVar18;
        }
        if (!bVar7) {
          fVar14 = fVar18;
        }
        pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar14;
        pIVar2->SliderCurrentAccumDirty = false;
        goto LAB_0021738e;
      }
      bVar7 = false;
      goto LAB_002173ed;
    }
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] == false) {
        ClearActiveID();
LAB_00217741:
        bVar7 = false;
        goto LAB_002173ed;
      }
      pfVar5 = ImVec2::operator[](&(pIVar2->IO).MousePos,idx);
      fVar12 = 0.0;
      if (0.0 < fVar18) {
        fVar18 = (*pfVar5 - fVar16) / fVar18;
        fVar12 = 1.0;
        if (fVar18 <= 1.0) {
          fVar12 = fVar18;
        }
        fVar12 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar12);
      }
      if (uVar3 != 0) {
        fVar12 = 1.0 - fVar12;
      }
LAB_0021738e:
      uVar6 = ScaleValueFromRatioT<unsigned_int,int,float>
                        (data_type,fVar12,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                         logarithmic_zero_epsilon,fVar17);
      if ((flags & 0x40U) == 0) {
        uVar6 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar6);
      }
      if (*v != uVar6) {
        *v = uVar6;
        bVar7 = true;
        goto LAB_002173ed;
      }
    }
  }
  bVar7 = false;
LAB_002173ed:
  if (1.0 <= fVar10) {
    fVar10 = ScaleRatioFromValueT<unsigned_int,int,float>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                        logarithmic_zero_epsilon,fVar17);
    if (uVar3 != 0) {
      fVar10 = 1.0 - fVar10;
    }
    fVar16 = (((fVar11 + -2.0) - fVar9 * 0.5) - fVar16) * fVar10 + fVar16;
    if (uVar3 != 0) {
      fVar10 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar9 * 0.5 + fVar16;
      (out_grab_bb->Max).x = fVar10 + -2.0;
      (out_grab_bb->Max).y = fVar9 * 0.5 + fVar16;
    }
    else {
      fVar10 = (bb->Min).y;
      fVar11 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar9 * 0.5 + fVar16;
      (out_grab_bb->Min).y = fVar10 + 2.0;
      (out_grab_bb->Max).x = fVar9 * 0.5 + fVar16;
      (out_grab_bb->Max).y = fVar11 + -2.0;
    }
  }
  else {
    IVar15 = bb->Min;
    out_grab_bb->Min = IVar15;
    out_grab_bb->Max = IVar15;
  }
  return bVar7;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}